

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh.c
# Opt level: O1

void nsh_display_history_entry(nsh_t *nsh)

{
  nsh_status_t nVar1;
  size_t sVar2;
  
  if (nsh->current_history_entry != 0xffffffff) {
    nVar1 = nsh_history_get_entry(&nsh->history,nsh->current_history_entry,(char *)nsh);
    if (nVar1 == NSH_STATUS_OK) {
      nsh_io_erase_line();
      nsh_io_print_prompt();
      nsh_io_put_string((char *)nsh);
      sVar2 = strlen((char *)nsh);
      (nsh->line).size = (uint)sVar2;
    }
    return;
  }
  nsh_io_erase_line();
  nsh_io_print_prompt();
  nsh_line_buffer_reset(&nsh->line);
  return;
}

Assistant:

static void nsh_display_history_entry(nsh_t* nsh)
{
    if (nsh->current_history_entry == NSH_HISTORY_INVALID_ENTRY) {
        nsh_io_erase_line();
        nsh_io_print_prompt();
        nsh_line_buffer_reset(&nsh->line);
    } else {
        nsh_status_t status = nsh_history_get_entry(&nsh->history, nsh->current_history_entry, nsh->line.buffer);
        if (status == NSH_STATUS_OK) {
            nsh_io_erase_line();
            nsh_io_print_prompt();
            nsh_io_put_string(nsh->line.buffer);
            nsh->line.size = (unsigned int)strlen(nsh->line.buffer);
        }
    }
}